

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

bool __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char>::checkResult
          (TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *this,
          uchar expectedValue,uchar expectedBorderColor,GLint layer)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLsizei GVar6;
  GLenum GVar7;
  GLenum GVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  reference pvVar10;
  TestConfiguration<unsigned_short,_unsigned_char> *pTVar11;
  allocator<unsigned_char> local_41;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> resultData;
  Functions *gl;
  GLint layer_local;
  uchar expectedBorderColor_local;
  uchar expectedValue_local;
  TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *this_local;
  
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar9->_vptr_RenderContext[3])();
  resultData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  (**(code **)(resultData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x78))(0x8ca8,this->m_fbo_id);
  dVar3 = (**(code **)(resultData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x800))();
  glu::checkError(dVar3,"Error binding framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x2dd);
  pTVar11 = &this->m_test_configuration;
  GVar4 = TestConfiguration<unsigned_short,_unsigned_char>::get_width(pTVar11);
  GVar5 = TestConfiguration<unsigned_short,_unsigned_char>::get_height(pTVar11);
  GVar6 = TestConfiguration<unsigned_short,_unsigned_char>::get_n_out_components(pTVar11);
  std::allocator<unsigned_char>::allocator(&local_41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
             (ulong)(GVar4 * GVar5 * GVar6),&local_41);
  std::allocator<unsigned_char>::~allocator(&local_41);
  pcVar1 = *(code **)(resultData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x1220);
  pTVar11 = &this->m_test_configuration;
  GVar4 = TestConfiguration<unsigned_short,_unsigned_char>::get_width(pTVar11);
  GVar5 = TestConfiguration<unsigned_short,_unsigned_char>::get_height(pTVar11);
  GVar7 = TestConfiguration<unsigned_short,_unsigned_char>::get_output_format(pTVar11);
  GVar8 = TestConfiguration<unsigned_short,_unsigned_char>::get_output_type(pTVar11);
  pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  (*pcVar1)(0,0,GVar4,GVar5,GVar7,GVar8,pvVar10);
  dVar3 = (**(code **)(resultData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x800))();
  glu::checkError(dVar3,"Error reading pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x2ea);
  GVar7 = TestConfiguration<unsigned_short,_unsigned_char>::get_filtering
                    (&this->m_test_configuration);
  if (GVar7 == 0x2600) {
    this_local._7_1_ =
         checkNearest(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                      expectedValue,expectedBorderColor,layer);
  }
  else {
    this_local._7_1_ =
         checkLinear(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,layer);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool TextureBorderClampSamplingTexture<InputType, OutputType>::checkResult(OutputType expectedValue,
																		   OutputType expectedBorderColor,
																		   glw::GLint layer)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind draw framebuffer to read framebuffer */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding framebuffer object!");

	std::vector<OutputType> resultData(m_test_configuration.get_width() * m_test_configuration.get_height() *
									   m_test_configuration.get_n_out_components());

	/* Read data from framebuffer */
	gl.readPixels(0,										/* x */
				  0,										/* y */
				  m_test_configuration.get_width(),			/* width */
				  m_test_configuration.get_height(),		/* height */
				  m_test_configuration.get_output_format(), /* format */
				  m_test_configuration.get_output_type(),   /* type */
				  &resultData[0]);							/* data */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixels from color buffer");

	/* Choose comparision method depending on filtering mode */
	if (m_test_configuration.get_filtering() == GL_NEAREST)
	{
		return checkNearest(resultData, expectedValue, expectedBorderColor, layer);
	}
	else
	{
		return checkLinear(resultData, layer);
	}
}